

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O3

parasail_profile_t *
parasail_profile_create_stats_sse_128_64(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  void *pvVar9;
  parasail_profile_t *ppVar10;
  ulong uVar11;
  ulong *puVar12;
  long lVar13;
  ulong *puVar14;
  size_t size;
  long *plVar15;
  ulong uVar16;
  bool bVar17;
  int iVar18;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  __m128i_64_t s;
  __m128i_64_t m;
  __m128i_64_t p;
  ulong local_c0;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  long local_48;
  long alStack_40 [2];
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_stats_sse_128_64_cold_2();
  }
  else if (s1 == (char *)0x0) {
    parasail_profile_create_stats_sse_128_64_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar1 = matrix->size;
    uVar4 = (_s1Len - (_s1Len + 1 >> 0x1f)) + 1 >> 1;
    size = (long)(int)(uVar4 * uVar1) << 4;
    pvVar7 = parasail_memalign(0x10,size);
    if ((((pvVar7 != (void *)0x0) && (pvVar8 = parasail_memalign(0x10,size), pvVar8 != (void *)0x0))
        && (pvVar9 = parasail_memalign(0x10,size), pvVar9 != (void *)0x0)) &&
       (ppVar10 = parasail_profile_new(s1,_s1Len,matrix), ppVar10 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar1) {
        uVar11 = 1;
        if (1 < (int)uVar4) {
          uVar11 = (ulong)uVar4;
        }
        local_c0 = 0;
        lVar13 = 0;
        do {
          if (0 < _s1Len) {
            lVar13 = (long)(int)lVar13;
            iVar5 = 0;
            uVar21 = 0;
            pcVar20 = s1;
            do {
              iVar2 = matrix->type;
              lVar19 = 0;
              puVar12 = &local_68;
              puVar14 = &local_58;
              plVar15 = &local_48;
              bVar3 = true;
              iVar6 = iVar5;
              do {
                bVar17 = bVar3;
                iVar18 = (int)lVar19 + (int)uVar21;
                if (iVar2 == 0) {
                  if (_s1Len <= iVar18) goto LAB_005ab174;
                  iVar22 = matrix->mapper[(byte)pcVar20[lVar19]] + (int)local_c0 * uVar1;
LAB_005ab167:
                  lVar23 = (long)matrix->matrix[iVar22];
                }
                else {
                  if (iVar18 < _s1Len) {
                    iVar22 = matrix->mapper[(byte)matrix->alphabet[local_c0]] + iVar6;
                    goto LAB_005ab167;
                  }
LAB_005ab174:
                  lVar23 = 0;
                }
                *plVar15 = lVar23;
                if (iVar18 < _s1Len) {
                  uVar16 = (ulong)(local_c0 == (uint)matrix->mapper[(byte)pcVar20[lVar19]]);
                }
                else {
                  uVar16 = 0;
                }
                *puVar14 = uVar16;
                *puVar12 = (ulong)(0 < lVar23);
                iVar6 = iVar6 + uVar4 * uVar1;
                lVar19 = lVar19 + (ulong)uVar4;
                puVar12 = &uStack_60;
                puVar14 = &uStack_50;
                plVar15 = alStack_40;
                bVar3 = false;
              } while (bVar17);
              lVar19 = lVar13 * 0x10;
              *(long *)((long)pvVar7 + lVar19) = local_48;
              ((long *)((long)pvVar7 + lVar19))[1] = alStack_40[0];
              *(ulong *)((long)pvVar8 + lVar19) = local_58;
              ((ulong *)((long)pvVar8 + lVar19))[1] = uStack_50;
              *(ulong *)((long)pvVar9 + lVar19) = local_68;
              ((ulong *)((long)pvVar9 + lVar19))[1] = uStack_60;
              lVar13 = lVar13 + 1;
              uVar21 = uVar21 + 1;
              iVar5 = iVar5 + uVar1;
              pcVar20 = pcVar20 + 1;
            } while (uVar21 != uVar11);
          }
          local_c0 = local_c0 + 1;
        } while (local_c0 != uVar1);
      }
      (ppVar10->profile64).score = pvVar7;
      (ppVar10->profile64).matches = pvVar8;
      (ppVar10->profile64).similar = pvVar9;
      ppVar10->free = parasail_free___m128i;
      return ppVar10;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_sse_128_64(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 2; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_64_t p;
            __m128i_64_t m;
            __m128i_64_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], p.m);
            _mm_store_si128(&vProfileM[index], m.m);
            _mm_store_si128(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile64.score = vProfile;
    profile->profile64.matches = vProfileM;
    profile->profile64.similar = vProfileS;
    profile->free = &parasail_free___m128i;
    return profile;
}